

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

ON_OBSOLETE_V5_Annotation *
ON_OBSOLETE_V5_Annotation::CreateFromV6Annotation
          (ON_Annotation *V6_annotation,ON_3dmAnnotationContext *annotation_context)

{
  ON_Text *V6_text_object_00;
  ON_Leader *V6_leader_00;
  ON_DimRadial *V6_dim_radial_00;
  ON_DimLinear *V6_dim_linear_00;
  ON_DimAngular *V6_dim_angular;
  ON_DimOrdinate *V6_dim_ordinate_00;
  ON_DimOrdinate *V6_dim_ordinate;
  ON_DimAngular *V6_dim_angle;
  ON_DimLinear *V6_dim_linear;
  ON_DimRadial *V6_dim_radial;
  ON_Leader *V6_leader;
  ON_Text *V6_text_object;
  ON_3dmAnnotationContext *annotation_context_local;
  ON_Annotation *V6_annotation_local;
  
  V6_text_object_00 = ON_Text::Cast((ON_Object *)V6_annotation);
  if (V6_text_object_00 == (ON_Text *)0x0) {
    V6_leader_00 = ON_Leader::Cast((ON_Object *)V6_annotation);
    if (V6_leader_00 == (ON_Leader *)0x0) {
      V6_dim_radial_00 = ON_DimRadial::Cast((ON_Object *)V6_annotation);
      if (V6_dim_radial_00 == (ON_DimRadial *)0x0) {
        V6_dim_linear_00 = ON_DimLinear::Cast((ON_Object *)V6_annotation);
        if (V6_dim_linear_00 == (ON_DimLinear *)0x0) {
          V6_dim_angular = ON_DimAngular::Cast((ON_Object *)V6_annotation);
          if (V6_dim_angular == (ON_DimAngular *)0x0) {
            V6_dim_ordinate_00 = ON_DimOrdinate::Cast((ON_Object *)V6_annotation);
            if (V6_dim_ordinate_00 == (ON_DimOrdinate *)0x0) {
              V6_annotation_local = (ON_Annotation *)0x0;
            }
            else {
              V6_annotation_local =
                   (ON_Annotation *)
                   ON_OBSOLETE_V5_DimOrdinate::CreateFromV6DimOrdinate
                             (V6_dim_ordinate_00,annotation_context,
                              (ON_OBSOLETE_V5_DimOrdinate *)0x0);
            }
          }
          else {
            V6_annotation_local =
                 (ON_Annotation *)
                 ON_OBSOLETE_V5_DimAngular::CreateFromV6DimAngular
                           (V6_dim_angular,annotation_context,(ON_OBSOLETE_V5_DimAngular *)0x0);
          }
        }
        else {
          V6_annotation_local =
               (ON_Annotation *)
               ON_OBSOLETE_V5_DimLinear::CreateFromV6DimLinear
                         (V6_dim_linear_00,annotation_context,(ON_OBSOLETE_V5_DimLinear *)0x0);
        }
      }
      else {
        V6_annotation_local =
             (ON_Annotation *)
             ON_OBSOLETE_V5_DimRadial::CreateFromV6DimRadial
                       (V6_dim_radial_00,annotation_context,(ON_OBSOLETE_V5_DimRadial *)0x0);
      }
    }
    else {
      V6_annotation_local =
           (ON_Annotation *)
           ON_OBSOLETE_V5_Leader::CreateFromV6Leader
                     (V6_leader_00,annotation_context,(ON_OBSOLETE_V5_Leader *)0x0);
    }
  }
  else {
    V6_annotation_local =
         (ON_Annotation *)
         ON_OBSOLETE_V5_TextObject::CreateFromV6TextObject
                   (V6_text_object_00,annotation_context,(ON_OBSOLETE_V5_TextObject *)0x0);
  }
  return (ON_OBSOLETE_V5_Annotation *)V6_annotation_local;
}

Assistant:

ON_OBSOLETE_V5_Annotation* ON_OBSOLETE_V5_Annotation::CreateFromV6Annotation(
  const class ON_Annotation& V6_annotation,
  const class ON_3dmAnnotationContext* annotation_context
)
{
  const ON_Text* V6_text_object = ON_Text::Cast(&V6_annotation);
  if (nullptr != V6_text_object)
    return ON_OBSOLETE_V5_TextObject::CreateFromV6TextObject(*V6_text_object, annotation_context, nullptr);

  const ON_Leader* V6_leader = ON_Leader::Cast(&V6_annotation);
  if (nullptr != V6_leader)
    return ON_OBSOLETE_V5_Leader::CreateFromV6Leader(*V6_leader, annotation_context, nullptr);

  const ON_DimRadial* V6_dim_radial = ON_DimRadial::Cast(&V6_annotation);
  if (nullptr != V6_dim_radial)
    return ON_OBSOLETE_V5_DimRadial::CreateFromV6DimRadial(*V6_dim_radial, annotation_context, nullptr);

  const ON_DimLinear* V6_dim_linear = ON_DimLinear::Cast(&V6_annotation);
  if (nullptr != V6_dim_linear)
    return ON_OBSOLETE_V5_DimLinear::CreateFromV6DimLinear(*V6_dim_linear, annotation_context, nullptr);

  const ON_DimAngular* V6_dim_angle = ON_DimAngular::Cast(&V6_annotation);
  if (nullptr != V6_dim_angle)
    return ON_OBSOLETE_V5_DimAngular::CreateFromV6DimAngular(*V6_dim_angle, annotation_context, nullptr);

  const ON_DimOrdinate* V6_dim_ordinate = ON_DimOrdinate::Cast(&V6_annotation);
  if (nullptr != V6_dim_ordinate)
    return ON_OBSOLETE_V5_DimOrdinate::CreateFromV6DimOrdinate(*V6_dim_ordinate, annotation_context, nullptr);

  return nullptr;
}